

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O1

ssize_t __thiscall
icu_63::StringTrieBuilder::BranchHeadNode::write
          (BranchHeadNode *this,int __fd,void *__buf,size_t __n)

{
  char cVar1;
  int32_t iVar2;
  int iVar3;
  ssize_t sVar4;
  int iVar6;
  undefined4 in_register_00000034;
  long *plVar7;
  long lVar5;
  
  plVar7 = (long *)CONCAT44(in_register_00000034,__fd);
  (*(this->next->super_UObject)._vptr_UObject[5])();
  iVar6 = this->length;
  iVar3 = (**(code **)(*plVar7 + 0x60))(plVar7);
  if (iVar3 < iVar6) {
    (**(code **)(*plVar7 + 0x78))(plVar7,this->length + -1);
    cVar1 = (this->super_ValueNode).hasValue;
    iVar2 = (this->super_ValueNode).value;
    lVar5 = *plVar7;
    iVar6 = 0;
  }
  else {
    cVar1 = (this->super_ValueNode).hasValue;
    iVar2 = (this->super_ValueNode).value;
    iVar6 = this->length + -1;
    lVar5 = *plVar7;
  }
  sVar4 = (**(code **)(lVar5 + 0x90))(plVar7,(int)cVar1,iVar2,iVar6);
  (this->super_ValueNode).super_Node.offset = (int32_t)sVar4;
  return sVar4;
}

Assistant:

void
StringTrieBuilder::BranchHeadNode::write(StringTrieBuilder &builder) {
    next->write(builder);
    if(length<=builder.getMinLinearMatch()) {
        offset=builder.writeValueAndType(hasValue, value, length-1);
    } else {
        builder.write(length-1);
        offset=builder.writeValueAndType(hasValue, value, 0);
    }
}